

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_send_pong_frame_no_ws(void)

{
  cio_error cVar1;
  char buffer [9];
  cio_write_buffer wb;
  cio_write_buffer wbh;
  undefined8 local_60;
  undefined1 local_58;
  cio_write_buffer local_50;
  cio_write_buffer local_30;
  
  local_60 = 0x6161616161616161;
  local_58 = 0;
  local_30.next = &local_50;
  local_50.data.element.length = 9;
  local_30.data.head.q_len = 1;
  local_30.data.element.length = 9;
  local_50.next = &local_30;
  local_50.prev = &local_30;
  local_50.data.head.q_len = (size_t)&local_60;
  local_30.prev = local_30.next;
  cVar1 = cio_websocket_write_pong((cio_websocket *)0x0,&local_30,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,"Writing a pong frame did not succeed!",0x969,UNITY_DISPLAY_STYLE_INT
            );
  UnityAssertEqualNumber
            (0,(ulong)write_handler_fake.call_count,"Write handler was called",0x96a,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_error_fake.call_count,"error callback was called",0x96b,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,local_30.data.head.q_len,"Length of write buffer different than before writing!",
             0x96d,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&local_30,(UNITY_INT)(local_30.next)->next,
             "Concatenation of write buffers no longer correct after writing!",0x96e,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualMemory
            (&local_60,((local_30.next)->data).element.field_0.const_data,9,1,
             "Content of writebuffer not correct after writing!",0x96f,UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_send_pong_frame_no_ws(void)
{
	char buffer[] = "aaaaaaaa";

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&wbh, &wb);

	enum cio_error err = cio_websocket_write_pong(NULL, &wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Writing a pong frame did not succeed!");
	TEST_ASSERT_EQUAL_MESSAGE(0, write_handler_fake.call_count, "Write handler was called");
	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Length of write buffer different than before writing!");
	TEST_ASSERT_EQUAL_MESSAGE(&wbh, wbh.next->next, "Concatenation of write buffers no longer correct after writing!");
	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(buffer, wbh.next->data.element.data, sizeof(buffer), "Content of writebuffer not correct after writing!");
}